

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isCubeLevelCompareResultValid
               (TextureCubeView *texture,int levelNdx,Sampler *sampler,FilterMode filterMode,
               TexComparePrecision *prec,CubeFaceFloatCoords *coords,float cmpReference,float result
               )

{
  CubeFaceFloatCoords *pCVar1;
  Sampler *pSVar2;
  ConstPixelBufferAccess *pCVar3;
  Vector<float,_2> local_58;
  Vector<float,_2> local_50;
  float local_48;
  float local_44;
  float result_local;
  float cmpReference_local;
  CubeFaceFloatCoords *coords_local;
  TexComparePrecision *prec_local;
  Sampler *pSStack_28;
  FilterMode filterMode_local;
  Sampler *sampler_local;
  TextureCubeView *pTStack_18;
  int levelNdx_local;
  TextureCubeView *texture_local;
  
  local_48 = result;
  local_44 = cmpReference;
  _result_local = coords;
  coords_local = (CubeFaceFloatCoords *)prec;
  prec_local._4_4_ = filterMode;
  pSStack_28 = sampler;
  sampler_local._4_4_ = levelNdx;
  pTStack_18 = texture;
  if (filterMode == LINEAR) {
    if ((sampler->seamlessCubeMap & 1U) == 0) {
      pCVar3 = TextureCubeView::getLevelFace(texture,levelNdx,coords->face);
      pSVar2 = pSStack_28;
      pCVar1 = coords_local;
      Vector<float,_2>::Vector(&local_50,_result_local->s,_result_local->t);
      texture_local._7_1_ =
           isLinearCompareResultValid
                     (pCVar3,pSVar2,(TexComparePrecision *)pCVar1,&local_50,0,local_44,local_48);
    }
    else {
      texture_local._7_1_ =
           isSeamlessLinearCompareResultValid
                     (texture,levelNdx,sampler,prec,coords,cmpReference,result);
    }
  }
  else {
    pCVar3 = TextureCubeView::getLevelFace(texture,levelNdx,coords->face);
    pSVar2 = pSStack_28;
    pCVar1 = coords_local;
    Vector<float,_2>::Vector(&local_58,_result_local->s,_result_local->t);
    texture_local._7_1_ =
         isNearestCompareResultValid
                   (pCVar3,pSVar2,(TexComparePrecision *)pCVar1,&local_58,0,local_44,local_48);
  }
  return texture_local._7_1_;
}

Assistant:

static bool isCubeLevelCompareResultValid (const TextureCubeView&			texture,
										   const int						levelNdx,
										   const Sampler&					sampler,
										   const Sampler::FilterMode		filterMode,
										   const TexComparePrecision&		prec,
										   const CubeFaceFloatCoords&		coords,
										   const float						cmpReference,
										   const float						result)
{
	if (filterMode == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamlessLinearCompareResultValid(texture, levelNdx, sampler, prec, coords, cmpReference, result);
		else
			return isLinearCompareResultValid(texture.getLevelFace(levelNdx, coords.face), sampler, prec, Vec2(coords.s, coords.t), 0, cmpReference, result);
	}
	else
		return isNearestCompareResultValid(texture.getLevelFace(levelNdx, coords.face), sampler, prec, Vec2(coords.s, coords.t), 0, cmpReference, result);
}